

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matryoshka.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type *psVar1;
  undefined8 *puVar2;
  int iVar3;
  void *pvVar4;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *data;
  size_type start1;
  int *piVar5;
  pointer pDVar6;
  pointer pdVar7;
  pointer pvVar8;
  undefined1 *puVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  element_type *this_00;
  undefined1 auVar10 [8];
  undefined8 uVar11;
  size_t sVar12;
  double __n;
  int areaCovered;
  typed_value<double,_char> *ptVar13;
  char *pcVar14;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar15;
  typed_value<unsigned_long,_char> *ptVar16;
  typed_value<bool,_char> *ptVar17;
  typed_value<int,_char> *ptVar18;
  const_iterator cVar19;
  ostream *poVar20;
  double **VI_S;
  double *pdVar21;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var22;
  long *plVar23;
  undefined8 uVar24;
  options_description *poVar25;
  pointer pcVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  size_type *psVar30;
  pointer pDVar31;
  _Alloc_hider _Var32;
  int iVar33;
  ulong uVar34;
  uint uVar35;
  double dVar36;
  long lVar37;
  ulong uVar38;
  pointer pbVar39;
  float fVar40;
  undefined1 auVar41 [16];
  size_type asStack_840 [2];
  undefined1 *puStack_830;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_828;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_810;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_7f8;
  undefined1 *local_7d0;
  options_description opts;
  undefined1 local_7c0 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_7a8 [24];
  void *local_790;
  undefined4 local_788;
  undefined8 local_780;
  undefined4 local_778;
  undefined8 local_770;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_768 [24];
  undefined1 local_750 [8];
  variables_map vm;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_740 [8];
  _Rb_tree_node_base local_738;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_710 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6e0;
  undefined1 local_6b0 [16];
  _Alloc_hider local_6a0;
  char local_690 [16];
  int local_680;
  vector<double,_std::allocator<double>_> local_678;
  double local_660;
  undefined1 local_658 [16];
  _Alloc_hider local_648;
  char local_638 [16];
  int local_628;
  vector<double,_std::allocator<double>_> local_620;
  double local_608;
  string local_600;
  string local_5e0;
  string local_5c0;
  vector<Domain,_std::allocator<Domain>_> local_5a0;
  vector<Domain,_std::allocator<Domain>_> local_588;
  vector<Domain,_std::allocator<Domain>_> local_570;
  undefined1 local_558 [16];
  _Alloc_hider local_548;
  char local_538 [16];
  int local_528;
  vector<double,_std::allocator<double>_> local_520;
  double local_508;
  undefined1 local_500 [16];
  _Alloc_hider local_4f0;
  char local_4e0 [16];
  int local_4d0;
  vector<double,_std::allocator<double>_> local_4c8;
  double local_4b0;
  undefined1 local_4a8 [16];
  _Alloc_hider local_498;
  char local_488 [16];
  int local_478;
  vector<double,_std::allocator<double>_> local_470;
  double local_458;
  undefined1 local_450 [16];
  _Alloc_hider local_440;
  char local_430 [16];
  int local_420;
  vector<double,_std::allocator<double>_> local_418;
  double local_400;
  undefined1 local_3f8 [16];
  _Alloc_hider local_3e8;
  char local_3d8 [16];
  int local_3c8;
  vector<double,_std::allocator<double>_> local_3c0;
  double local_3a8;
  string local_3a0;
  undefined1 local_380 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  allMu;
  undefined1 local_358 [24];
  DomainSet dConsensusHier;
  undefined1 local_320 [24];
  pointer local_308;
  undefined1 *local_300;
  undefined1 local_2f8 [8];
  vector<int,_std::allocator<int>_> PAMresult;
  vector<int,_std::allocator<int>_> temp;
  WeightedDomainEnsemble dEnsemble;
  pointer local_290;
  double local_278;
  shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  local_268;
  size_type *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> consensusFile_1;
  shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  mat_topass;
  undefined1 auStack_1f8 [8];
  vector<Domain,_std::allocator<Domain>_> dConsensusHierTemp;
  undefined1 local_1d8 [8];
  Params p;
  pointer pcStack_140;
  undefined1 auStack_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> consensusFile;
  undefined1 auStack_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> multiscaleFile;
  ulong local_a0;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  int local_68;
  vector<double,_std::allocator<double>_> local_60;
  double local_48;
  double local_40;
  pointer local_38;
  
  local_1d8 = (undefined1  [8])&p.inputFile._M_string_length;
  p.inputFile._M_dataplus._M_p = (pointer)0x0;
  p.inputFile._M_string_length._0_1_ = 0;
  p.inputFile.field_2._8_8_ = &p.outputPrefix._M_string_length;
  p.outputPrefix._M_dataplus._M_p = (pointer)0x0;
  p.outputPrefix._M_string_length._0_1_ = 0;
  p._104_8_ = &p.chrom._M_string_length;
  p.chrom._M_dataplus._M_p = (pointer)0x0;
  p.chrom._M_string_length._0_1_ = 0;
  puStack_830 = (undefined1 *)0x125df0;
  local_750 = (undefined1  [8])local_740;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"matryoshka options","");
  puStack_830 = (undefined1 *)0x125e10;
  boost::program_options::options_description::options_description
            ((options_description *)&local_7d0,(string *)local_750,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  local_40 = (double)CONCAT44(local_40._4_4_,argc);
  if (local_750 != (undefined1  [8])local_740) {
    puStack_830 = (undefined1 *)0x125e25;
    operator_delete((void *)local_750);
  }
  puStack_830 = (undefined1 *)0x125e31;
  local_98._0_8_ = boost::program_options::options_description::add_options();
  puStack_830 = (undefined1 *)0x125e44;
  ptVar13 = boost::program_options::value<double>((double *)((long)&p.outputPrefix.field_2 + 8));
  ptVar13->m_required = true;
  puStack_830 = (undefined1 *)0x125e68;
  pcVar14 = (char *)boost::program_options::options_description_easy_init::operator()
                              (local_98,(value_semantic *)"gammaMax,g",(char *)ptVar13);
  puStack_830 = (undefined1 *)0x125e77;
  ptVar13 = boost::program_options::value<double>(&p.gammaMax);
  temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  puStack_830 = (undefined1 *)0x125e8d;
  ptVar13 = boost::program_options::typed_value<double,_char>::default_value
                      (ptVar13,(double *)
                               &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
  puStack_830 = (undefined1 *)0x125ea6;
  pcVar14 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar14,(value_semantic *)"gammaMin,x",(char *)ptVar13);
  puStack_830 = (undefined1 *)0x125ebc;
  pcVar14 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar14,"help,h");
  puStack_830 = (undefined1 *)0x125ecb;
  ptVar15 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d8);
  ptVar15->m_required = true;
  puStack_830 = (undefined1 *)0x125eeb;
  pcVar14 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar14,(value_semantic *)"input,i",(char *)ptVar15);
  puStack_830 = (undefined1 *)0x125efa;
  ptVar16 = boost::program_options::value<unsigned_long>((unsigned_long *)&p.gammaMin);
  auStack_e8 = (undefined1  [8])0x1;
  puStack_830 = (undefined1 *)0x125f10;
  ptVar16 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                      (ptVar16,(unsigned_long *)auStack_e8);
  puStack_830 = (undefined1 *)0x125f29;
  pcVar14 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar14,(value_semantic *)"topK,k",(char *)ptVar16);
  puStack_830 = (undefined1 *)0x125f38;
  ptVar17 = boost::program_options::value<bool>((bool *)&p.stepSize);
  ptVar17->m_zero_tokens = true;
  PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  puStack_830 = (undefined1 *)0x125f51;
  ptVar17 = boost::program_options::typed_value<bool,_char>::default_value
                      (ptVar17,(bool *)&PAMresult.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  puStack_830 = (undefined1 *)0x125f6a;
  pcVar14 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar14,(value_semantic *)"outputMultiscale,m",(char *)ptVar17);
  puStack_830 = (undefined1 *)0x125f79;
  ptVar18 = boost::program_options::value<int>((int *)((long)&p.stepSize + 4));
  local_258 = (size_type *)CONCAT44(local_258._4_4_,100);
  puStack_830 = (undefined1 *)0x125f8e;
  ptVar18 = boost::program_options::typed_value<int,_char>::default_value(ptVar18,(int *)&local_258)
  ;
  puStack_830 = (undefined1 *)0x125fa7;
  pcVar14 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar14,(value_semantic *)"minMeanSamples,n",(char *)ptVar18);
  puStack_830 = (undefined1 *)0x125fb6;
  ptVar15 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&p.inputFile.field_2 + 8));
  ptVar15->m_required = true;
  puStack_830 = (undefined1 *)0x125fd6;
  pcVar14 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar14,(value_semantic *)"output,o",(char *)ptVar15);
  puStack_830 = (undefined1 *)0x125fe5;
  ptVar13 = boost::program_options::value<double>((double *)&p.k);
  auStack_118 = (undefined1  [8])0x3fa999999999999a;
  puStack_830 = (undefined1 *)0x126001;
  ptVar13 = boost::program_options::typed_value<double,_char>::default_value
                      (ptVar13,(double *)auStack_118);
  puStack_830 = (undefined1 *)0x12601a;
  pcVar14 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar14,(value_semantic *)"stepSize,s",(char *)ptVar13);
  puStack_830 = (undefined1 *)0x126029;
  ptVar18 = boost::program_options::value<int>((int *)&p.outputMultiscale);
  local_2f8._0_4_ = 40000;
  puStack_830 = (undefined1 *)0x12603e;
  ptVar18 = boost::program_options::typed_value<int,_char>::default_value(ptVar18,(int *)local_2f8);
  puStack_830 = (undefined1 *)0x126057;
  pcVar14 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar14,(value_semantic *)"resolution,r",(char *)ptVar18);
  puStack_830 = (undefined1 *)0x126066;
  ptVar17 = boost::program_options::value<bool>((bool *)&p.minMeanSamples);
  ptVar17->m_zero_tokens = true;
  p.chrom.field_2._8_8_ = p.chrom.field_2._8_8_ & 0xffffffffffffff00;
  puStack_830 = (undefined1 *)0x12607f;
  ptVar17 = boost::program_options::typed_value<bool,_char>::default_value
                      (ptVar17,(bool *)(p.chrom.field_2._M_local_buf + 8));
  puStack_830 = (undefined1 *)0x126098;
  pcVar14 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar14,(value_semantic *)"parseSparseFormat,R",(char *)ptVar17);
  piVar5 = &p.resolution;
  puStack_830 = (undefined1 *)0x1260aa;
  ptVar15 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)piVar5);
  puStack_830 = (undefined1 *)0x1260ca;
  local_750 = (undefined1  [8])local_740;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"N/A","");
  puStack_830 = (undefined1 *)0x1260d9;
  ptVar15 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(ptVar15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_750);
  puStack_830 = (undefined1 *)0x1260f2;
  boost::program_options::options_description_easy_init::operator()
            (pcVar14,(value_semantic *)"chromosome,c",(char *)ptVar15);
  if (local_750 != (undefined1  [8])local_740) {
    puStack_830 = (undefined1 *)0x126103;
    operator_delete((void *)local_750);
  }
  puStack_830 = (undefined1 *)0x12610f;
  boost::program_options::variables_map::variables_map((variables_map *)local_750);
  local_7f8.super_function_base.vtable = (vtable_base *)0x0;
  local_7f8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_7f8.super_function_base.functor._8_8_ = 0;
  local_7f8.super_function_base.functor._16_8_ = 0;
  puStack_830 = (undefined1 *)0x12613e;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_98,local_40._0_4_,argv,
             (options_description *)&local_7d0,0,&local_7f8);
  puStack_830 = (undefined1 *)0x126153;
  boost::program_options::store((basic_parsed_options *)local_98,(variables_map *)local_750,false);
  puStack_830 = (undefined1 *)0x12615f;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_98);
  puStack_830 = (undefined1 *)0x12616b;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_7f8);
  pbVar39 = (pointer)(local_98 + 0x10);
  puStack_830 = (undefined1 *)0x12618d;
  local_98._0_8_ = pbVar39;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"help","");
  puStack_830 = (undefined1 *)0x1261a0;
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_740,(key_type *)local_98);
  if ((pointer)local_98._0_8_ != pbVar39) {
    puStack_830 = (undefined1 *)0x1261bb;
    operator_delete((void *)local_98._0_8_);
  }
  if (cVar19._M_node != &local_738) {
    puStack_830 = (undefined1 *)0x1279ce;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "\n\t***********************************\n\t****                           ****\n\t****        MATRYOSHKA 1.0     ****\n\t****                           ****\n\t***********************************\n\t"
               ,0xbb);
    puStack_830 = (undefined1 *)0x1279e6;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    puStack_830 = (undefined1 *)0x1279f9;
    poVar20 = (ostream *)
              boost::program_options::operator<<
                        ((ostream *)&std::cerr,(options_description *)&local_7d0);
    puStack_830 = (undefined1 *)0x127a08;
    std::operator<<(poVar20,"\n");
LAB_001280e1:
    puStack_830 = &LAB_001280eb;
    exit(1);
  }
  puStack_830 = (undefined1 *)0x1261d0;
  boost::program_options::notify((variables_map *)local_750);
  puStack_830 = (undefined1 *)0x1261ed;
  local_98._0_8_ = pbVar39;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"input","");
  puStack_830 = (undefined1 *)0x126200;
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_740,(key_type *)local_98);
  if ((pointer)local_98._0_8_ != pbVar39) {
    puStack_830 = (undefined1 *)0x126214;
    operator_delete((void *)local_98._0_8_);
  }
  if (cVar19._M_node == &local_738) {
    puStack_830 = (undefined1 *)0x127a20;
    std::operator<<((ostream *)&std::cerr,"Input file was not set.\n");
    goto LAB_001280e1;
  }
  puStack_830 = (undefined1 *)0x126235;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Reading input from ",0x13);
  puStack_830 = (undefined1 *)0x12624f;
  poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(char *)local_1d8,(long)p.inputFile._M_dataplus._M_p);
  puStack_830 = (undefined1 *)0x126263;
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,".\n",2);
  puStack_830 = (undefined1 *)0x126279;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,"chr"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)piVar5);
  puStack_830 = (undefined1 *)0x12628b;
  std::__cxx11::string::operator=((string *)piVar5,(string *)local_98);
  if ((pointer)local_98._0_8_ != pbVar39) {
    puStack_830 = (undefined1 *)0x126298;
    operator_delete((void *)local_98._0_8_);
  }
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = (pointer)0x0;
  local_88._M_allocated_capacity = (size_type)&local_78;
  local_88._8_8_ = (options_description *)0x0;
  local_78._M_local_buf[0] = '\0';
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((char)p.minMeanSamples == '\x01') {
    puStack_830 = (undefined1 *)0x1262f1;
    local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_600,local_1d8,p.inputFile._M_dataplus._M_p + (long)local_1d8);
    puStack_830 = (undefined1 *)0x126320;
    local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5e0,p._104_8_,p.chrom._M_dataplus._M_p + p._104_8_);
    puStack_830 = (undefined1 *)0x12633d;
    parseSparseMatrix((MatrixProperties *)
                      &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,&local_600,p._96_4_,&local_5e0);
    uVar11 = local_98._8_8_;
    local_98._8_8_ =
         dEnsemble.domainSets.
         super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_98._0_8_ =
         temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    dEnsemble.domainSets.
    super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if ((pointer)uVar11 != (pointer)0x0) {
      puStack_830 = (undefined1 *)0x126366;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11);
    }
    puStack_830 = (undefined1 *)0x126378;
    std::__cxx11::string::operator=
              ((string *)(local_98 + 0x10),
               (string *)
               &dEnsemble.domainSets.
                super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    pdVar7 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_68 = (int)dEnsemble.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_290;
    if (pdVar7 != (pointer)0x0) {
      puStack_830 = (undefined1 *)0x1263bb;
      operator_delete(pdVar7);
    }
    local_48 = local_278;
    if (dEnsemble.domainSets.
        super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)&dEnsemble.weights) {
      puStack_830 = (undefined1 *)0x1263ee;
      operator_delete(dEnsemble.domainSets.
                      super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (dEnsemble.domainSets.
        super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      puStack_830 = (undefined1 *)0x1263ff;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 dEnsemble.domainSets.
                 super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
      puStack_830 = (undefined1 *)0x126410;
      operator_delete(local_5e0._M_dataplus._M_p);
    }
    _Var32._M_p = local_600._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600._M_dataplus._M_p == &local_600.field_2) goto LAB_00126533;
  }
  else {
    puStack_830 = (undefined1 *)0x12644d;
    local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5c0,local_1d8,p.inputFile._M_dataplus._M_p + (long)local_1d8);
    puStack_830 = (undefined1 *)0x126460;
    parseGZipMatrix((MatrixProperties *)
                    &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,&local_5c0);
    uVar11 = local_98._8_8_;
    local_98._8_8_ =
         dEnsemble.domainSets.
         super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_98._0_8_ =
         temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    dEnsemble.domainSets.
    super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if ((pointer)uVar11 != (pointer)0x0) {
      puStack_830 = (undefined1 *)0x126489;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11);
    }
    puStack_830 = (undefined1 *)0x12649b;
    std::__cxx11::string::operator=
              ((string *)(local_98 + 0x10),
               (string *)
               &dEnsemble.domainSets.
                super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    pdVar7 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_68 = (int)dEnsemble.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_290;
    if (pdVar7 != (pointer)0x0) {
      puStack_830 = (undefined1 *)0x1264de;
      operator_delete(pdVar7);
    }
    local_48 = local_278;
    if (dEnsemble.domainSets.
        super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)&dEnsemble.weights) {
      puStack_830 = (undefined1 *)0x126511;
      operator_delete(dEnsemble.domainSets.
                      super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (dEnsemble.domainSets.
        super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      puStack_830 = (undefined1 *)0x126522;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 dEnsemble.domainSets.
                 super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    _Var32._M_p = local_5c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0._M_dataplus._M_p == &local_5c0.field_2) goto LAB_00126533;
  }
  puStack_830 = (undefined1 *)0x126533;
  operator_delete(_Var32._M_p);
LAB_00126533:
  uVar24 = local_98._8_8_;
  uVar11 = local_98._0_8_;
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &((string *)local_98._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &((string *)local_98._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  puStack_830 = (undefined1 *)0x12657c;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"MatrixParser read matrix of size: ",0x22);
  puStack_830 = (undefined1 *)0x126592;
  poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  puStack_830 = (undefined1 *)0x1265a9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar20," x ",3);
  puStack_830 = (undefined1 *)0x1265bc;
  poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
  puStack_830 = (undefined1 *)0x1265d0;
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
  local_6b0._0_8_ = local_98._0_8_;
  local_6b0._8_8_ = local_98._8_8_;
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &((string *)local_98._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &((string *)local_98._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  local_38 = (pointer)uVar24;
  puStack_830 = (undefined1 *)0x12662c;
  local_6a0._M_p = local_690;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6a0,local_88._M_allocated_capacity,
             (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity));
  local_680 = local_68;
  puStack_830 = (undefined1 *)0x126642;
  std::vector<double,_std::allocator<double>_>::vector(&local_678,&local_60);
  local_660 = local_48;
  puStack_830 = (undefined1 *)0x126683;
  multiscaleDomains((WeightedDomainEnsemble *)
                    &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(MatrixProperties *)local_6b0,
                    (float)(double)p.outputPrefix.field_2._8_8_,(float)p.gammaMax,(double)p.k,
                    p.gammaMin._0_4_,p.stepSize._4_4_);
  if (local_678.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    puStack_830 = (undefined1 *)0x126694;
    operator_delete(local_678.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_6a0._M_p != local_690) {
    puStack_830 = (undefined1 *)0x1266a5;
    operator_delete(local_6a0._M_p);
  }
  if ((pointer)local_6b0._8_8_ != (pointer)0x0) {
    puStack_830 = (undefined1 *)0x1266b6;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6b0._8_8_);
  }
  local_658._0_8_ = local_98._0_8_;
  local_658._8_8_ = local_98._8_8_;
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &((string *)local_98._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &((string *)local_98._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  puStack_830 = (undefined1 *)0x12670e;
  local_648._M_p = local_638;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_648,local_88._M_allocated_capacity,
             (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity));
  local_628 = local_68;
  puStack_830 = (undefined1 *)0x126724;
  std::vector<double,_std::allocator<double>_>::vector(&local_620,&local_60);
  local_608 = local_48;
  puStack_830 = (undefined1 *)0x126741;
  areaCovered = calCoverage((WeightedDomainEnsemble *)
                            &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(MatrixProperties *)local_658
                           );
  if (local_620.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    puStack_830 = (undefined1 *)0x126758;
    operator_delete(local_620.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_648._M_p != local_638) {
    puStack_830 = (undefined1 *)0x126769;
    operator_delete(local_648._M_p);
  }
  if ((pointer)local_658._8_8_ != (pointer)0x0) {
    puStack_830 = (undefined1 *)0x12677a;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_658._8_8_);
  }
  local_40 = (double)(((long)dEnsemble.domainSets.
                             super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start -
                       (long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage >> 3) * -0x5555555555555555);
  if (p.stepSize._0_1_ == '\x01') {
    puStack_830 = (undefined1 *)0x1267c6;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Writing all multi scale domains to file",0x27);
    puStack_830 = (undefined1 *)0x1267da;
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
    puStack_830 = (undefined1 *)0x1267e9;
    std::ostream::put('\x18');
    puStack_830 = (undefined1 *)0x1267f1;
    std::ostream::flush();
    if (0 < (int)local_40._0_4_) {
      uVar35 = local_40._0_4_ & 0x7fffffff;
      lVar37 = 0;
      uVar34 = 0;
      do {
        auStack_e8 = (undefined1  [8])&multiscaleFile._M_string_length;
        puStack_830 = (undefined1 *)0x12683a;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)auStack_e8,p.inputFile.field_2._8_8_,
                   p.outputPrefix._M_dataplus._M_p + p.inputFile.field_2._8_8_);
        puStack_830 = (undefined1 *)0x12684c;
        std::__cxx11::string::append((char *)auStack_e8);
        puStack_830 = (undefined1 *)0x126862;
        std::vector<Domain,_std::allocator<Domain>_>::vector
                  (&local_5a0,
                   (vector<Domain,_std::allocator<Domain>_> *)
                   ((long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + lVar37));
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        puStack_830 = (undefined1 *)0x12688d;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a0,auStack_e8,
                   multiscaleFile._M_dataplus._M_p + (long)auStack_e8);
        local_558._0_8_ = local_98._0_8_;
        local_558._8_8_ = local_98._8_8_;
        if ((pointer)local_98._8_8_ != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &((string *)local_98._8_8_)->_M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &((string *)local_98._8_8_)->_M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        local_548._M_p = local_538;
        puStack_830 = (undefined1 *)0x1268e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_548,local_88._M_allocated_capacity,
                   (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity));
        local_528 = local_68;
        puStack_830 = (undefined1 *)0x126901;
        std::vector<double,_std::allocator<double>_>::vector(&local_520,&local_60);
        local_508 = local_48;
        puStack_830 = (undefined1 *)0x126946;
        outputDomains(&local_5a0,&local_3a0,(MatrixProperties *)local_558,0,
                      (float)((double)(int)uVar34 * (double)p.k + p.gammaMax));
        if (local_520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          puStack_830 = (undefined1 *)0x126957;
          operator_delete(local_520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_548._M_p != local_538) {
          puStack_830 = (undefined1 *)0x12696f;
          operator_delete(local_548._M_p);
        }
        if ((pointer)local_558._8_8_ != (pointer)0x0) {
          puStack_830 = (undefined1 *)0x126980;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          puStack_830 = (undefined1 *)0x126998;
          operator_delete(local_3a0._M_dataplus._M_p);
        }
        if (local_5a0.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          puStack_830 = (undefined1 *)0x1269a9;
          operator_delete(local_5a0.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (auStack_e8 != (undefined1  [8])&multiscaleFile._M_string_length) {
          puStack_830 = (undefined1 *)0x1269c1;
          operator_delete((void *)auStack_e8);
        }
        uVar34 = uVar34 + 1;
        lVar37 = lVar37 + 0x18;
      } while (uVar35 != uVar34);
    }
  }
  iVar27 = SUB84(local_40,0);
  dVar36 = (double)(long)iVar27;
  uVar34 = -(ulong)((ulong)dVar36 >> 0x3d != 0) | (long)dVar36 * 8;
  puStack_830 = (undefined1 *)0x1269fe;
  VI_S = (double **)operator_new__(uVar34);
  if (0 < iVar27) {
    uVar35 = SUB84(local_40,0);
    uVar38 = 0;
    do {
      puStack_830 = (undefined1 *)0x126a1a;
      pdVar21 = (double *)operator_new__(uVar34);
      VI_S[uVar38] = pdVar21;
      uVar38 = uVar38 + 1;
    } while ((uVar35 & 0x7fffffff) != uVar38);
  }
  puStack_830 = (undefined1 *)0x126a35;
  getVImatrix((WeightedDomainEnsemble *)
              &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,VI_S);
  puStack_830 = (undefined1 *)0x126a48;
  getCluster((vector<int,_std::allocator<int>_> *)local_2f8,VI_S,SUB84(local_40,0));
  lVar37 = CONCAT44(local_2f8._4_4_,local_2f8._0_4_);
  puStack_830 = (undefined1 *)0x126a62;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)local_2f8);
  puStack_830 = (undefined1 *)0x126a79;
  local_40 = dVar36;
  _Var22 = std::
           __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (CONCAT71(PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._1_7_,
                               PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._0_1_),
                      temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  lVar28 = (long)_Var22._M_current -
           CONCAT71(PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._1_7_,
                    PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._0_1_);
  puStack_830 = (undefined1 *)0x126a9b;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"There are ",10);
  uVar34 = lVar28 >> 2;
  puStack_830 = (undefined1 *)0x126ab5;
  iVar27 = (int)uVar34;
  poVar20 = (ostream *)std::ostream::operator<<(&std::cerr,iVar27);
  puStack_830 = (undefined1 *)0x126acc;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar20," levels of hierarchy with clustering: ",0x26);
  puStack_830 = (undefined1 *)0x126ae1;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
  puStack_830 = (undefined1 *)0x126aec;
  std::ostream::put((char)poVar20);
  puStack_830 = (undefined1 *)0x126af4;
  std::ostream::flush();
  uVar35 = (uint)((ulong)((long)PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start - lVar37) >> 2);
  if (0 < (int)uVar35) {
    uVar38 = 0;
    do {
      puStack_830 = (undefined1 *)0x126b31;
      poVar20 = (ostream *)
                std::ostream::operator<<
                          (&std::cerr,
                           *(int *)(CONCAT44(local_2f8._4_4_,local_2f8._0_4_) + uVar38 * 4));
      puStack_830 = (undefined1 *)0x126b41;
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
      uVar38 = uVar38 + 1;
    } while ((uVar35 & 0x7fffffff) != uVar38);
  }
  puStack_830 = (undefined1 *)0x126b61;
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
  puStack_830 = (undefined1 *)0x126b77;
  std::ostream::put('\x18');
  puStack_830 = (undefined1 *)0x126b7f;
  std::ostream::flush();
  dVar36 = p.gammaMax;
  uVar34 = (uVar34 & 0xffffffff) * 8 + 0xf & 0xfffffffffffffff0;
  lVar37 = -uVar34;
  pdVar21 = (double *)((long)&local_828 + lVar37);
  psVar30 = (size_type *)((long)pdVar21 - uVar34);
  piVar5 = (int *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_);
  iVar33 = *piVar5;
  local_300 = (undefined1 *)&local_828;
  *pdVar21 = p.gammaMax;
  *(undefined8 *)((long)psVar30 + (lVar28 * 0x40000000 + -0x100000000 >> 0x1d)) =
       p.outputPrefix.field_2._8_8_;
  __n = local_40;
  if (0 < (int)uVar35) {
    uVar34 = 0;
    iVar29 = 0;
    do {
      iVar3 = piVar5[uVar34];
      if (iVar33 != iVar3) {
        lVar28 = (long)iVar29;
        iVar29 = iVar29 + 1;
        *(double *)((long)&local_828 + lVar28 * 8 + lVar37 + 8) = dVar36;
        psVar30[lVar28] = (size_type)(dVar36 - (double)p.k);
        iVar33 = iVar3;
      }
      dVar36 = dVar36 + (double)p.k;
      uVar34 = uVar34 + 1;
    } while ((uVar35 & 0x7fffffff) != uVar34);
  }
  p.chrom.field_2._8_8_ = 0;
  pcStack_140 = (pointer)0x0;
  dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_1f8 = (undefined1  [8])0x0;
  dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  psVar30[-1] = 0x126c83;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_380,(size_type)__n,(allocator_type *)auStack_e8);
  if (p.gammaMax <= (double)p.outputPrefix.field_2._8_8_ + 1e-05) {
    lVar28 = 0;
    dVar36 = p.gammaMax;
    do {
      iVar33 = p.stepSize._4_4_;
      local_268.
      super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)uVar11;
      local_268.
      super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38;
      if (local_38 != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          psVar1 = &(local_38->string_key)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
          UNLOCK();
        }
        else {
          psVar1 = &(local_38->string_key)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
        }
      }
      local_40 = dVar36;
      psVar30[-1] = 0x126d10;
      getMu((vector<double,_std::allocator<double>_> *)auStack_e8,&local_268,(float)dVar36,iVar33);
      pvVar4 = *(void **)((long)&(((_Vector_base<double,_std::allocator<double>_> *)local_380)->
                                 _M_impl).super__Vector_impl_data._M_start + lVar28);
      puVar2 = (undefined8 *)
               ((long)&(((_Vector_base<double,_std::allocator<double>_> *)local_380)->_M_impl).
                       super__Vector_impl_data._M_start + lVar28);
      *puVar2 = auStack_e8;
      puVar2[1] = multiscaleFile._M_dataplus._M_p;
      *(size_type *)
       ((long)&(((_Vector_base<double,_std::allocator<double>_> *)local_380)->_M_impl).
               super__Vector_impl_data._M_end_of_storage + lVar28) = multiscaleFile._M_string_length
      ;
      auStack_e8 = (undefined1  [8])0x0;
      multiscaleFile._M_dataplus._M_p = (pointer)0x0;
      multiscaleFile._M_string_length = 0;
      if (pvVar4 != (void *)0x0) {
        psVar30[-1] = 0x126d66;
        operator_delete(pvVar4);
      }
      auVar10 = auStack_e8;
      if (auStack_e8 != (undefined1  [8])0x0) {
        psVar30[-1] = 0x126d77;
        operator_delete((void *)auVar10);
      }
      this._M_pi = local_268.
                   super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
      if ((pointer)local_268.
                   super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi != (pointer)0x0) {
        psVar30[-1] = 0x126d88;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
      }
      dVar36 = local_40 + (double)p.k;
      lVar28 = lVar28 + 0x18;
    } while (dVar36 <= (double)p.outputPrefix.field_2._8_8_ + 1e-05);
  }
  pbVar39 = local_38;
  if (0 < iVar27) {
    local_40 = (double)CONCAT44(local_40._4_4_,1);
    local_a0 = 0;
    uVar34 = 1;
    iVar33 = 0;
    do {
      uVar24 = local_88._M_allocated_capacity;
      if (uVar34 == 1) {
        p.outputPrefix.field_2._8_8_ = *psVar30;
        p.gammaMax = *pdVar21;
        local_500._0_8_ = local_98._0_8_;
        local_500._8_8_ = local_98._8_8_;
        if ((pointer)local_98._8_8_ != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &((string *)local_98._8_8_)->_M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &((string *)local_98._8_8_)->_M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        local_4f0._M_p = local_4e0;
        poVar25 = (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity);
        psVar30[-1] = 0x12742e;
        std::__cxx11::string::_M_construct<char*>((string *)&local_4f0,uVar24,poVar25);
        local_4d0 = local_68;
        psVar30[-1] = 0x127447;
        std::vector<double,_std::allocator<double>_>::vector(&local_4c8,&local_60);
        iVar3 = p.stepSize._4_4_;
        sVar12 = p.k;
        iVar29 = p.gammaMin._0_4_;
        dVar36 = p.gammaMax;
        local_4b0 = local_48;
        mat_topass.
        super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p.outputPrefix.field_2._8_8_;
        psVar30[-1] = 0x1274a7;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&local_828,
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)local_380);
        fVar40 = (float)(double)mat_topass.
                                super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
        psVar30[-2] = local_a0;
        psVar30[-3] = 0x1274ee;
        multiscaleDomains((WeightedDomainEnsemble *)auStack_e8,(MatrixProperties *)local_500,fVar40,
                          (float)dVar36,(double)sVar12,iVar29,iVar3,areaCovered,&local_828,
                          (int)psVar30[-2]);
        psVar30[-1] = 0x1274fa;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_828);
        pdVar7 = local_4c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_4c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          psVar30[-1] = 0x12750b;
          operator_delete(pdVar7);
        }
        _Var32._M_p = local_4f0._M_p;
        if (local_4f0._M_p != local_4e0) {
          psVar30[-1] = 0x12752a;
          operator_delete(_Var32._M_p);
        }
        uVar24 = local_500._8_8_;
        if ((pointer)local_500._8_8_ != (pointer)0x0) {
          psVar30[-1] = 0x12753b;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24);
        }
        psVar30[-1] = 0x12754a;
        consensusDomains((DomainSet *)auStack_118,(WeightedDomainEnsemble *)auStack_e8);
        uVar24 = p.chrom.field_2._8_8_;
        p.chrom.field_2._8_8_ = auStack_118;
        pcStack_140 = consensusFile._M_dataplus._M_p;
        auStack_118 = (undefined1  [8])0x0;
        consensusFile._M_dataplus._M_p = (pointer)0x0;
        consensusFile._M_string_length = 0;
        if (uVar24 != 0) {
          psVar30[-1] = 0x1275a1;
          operator_delete((void *)uVar24);
        }
        auVar10 = auStack_118;
        if (auStack_118 != (undefined1  [8])0x0) {
          psVar30[-1] = 0x1275b2;
          operator_delete((void *)auVar10);
        }
        uVar24 = p.inputFile.field_2._8_8_;
        auStack_118 = (undefined1  [8])&consensusFile._M_string_length;
        pcVar26 = p.outputPrefix._M_dataplus._M_p + p.inputFile.field_2._8_8_;
        psVar30[-1] = 0x1275e0;
        std::__cxx11::string::_M_construct<char*>((string *)auStack_118,uVar24,pcVar26);
        psVar30[-1] = 0x1275ef;
        std::__cxx11::string::append((char *)auStack_118);
        psVar30[-1] = 0x127607;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Writing consensus for level ",0x1c);
        psVar30[-1] = 0x127618;
        plVar23 = (long *)std::ostream::operator<<(&std::cerr,1);
        uVar24 = *(undefined8 *)(*plVar23 + -0x18);
        psVar30[-1] = 0x12762f;
        std::ios::widen((char)uVar24 + (char)plVar23);
        psVar30[-1] = 0x12763a;
        std::ostream::put((char)plVar23);
        psVar30[-1] = 0x127642;
        std::ostream::flush();
        psVar30[-1] = 0x127655;
        std::vector<Domain,_std::allocator<Domain>_>::vector
                  (&local_588,
                   (vector<Domain,_std::allocator<Domain>_> *)((long)&p.chrom.field_2 + 8));
        auVar10 = auStack_118;
        allMu.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_358;
        pcVar26 = consensusFile._M_dataplus._M_p + (long)auStack_118;
        psVar30[-1] = 0x127680;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   &allMu.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,auVar10,pcVar26);
        uVar24 = local_88._M_allocated_capacity;
        local_4a8._0_8_ = local_98._0_8_;
        local_4a8._8_8_ = local_98._8_8_;
        if ((pointer)local_98._8_8_ != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &((string *)local_98._8_8_)->_M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &((string *)local_98._8_8_)->_M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        local_498._M_p = local_488;
        poVar25 = (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity);
        psVar30[-1] = 0x1276db;
        std::__cxx11::string::_M_construct<char*>((string *)&local_498,uVar24,poVar25);
        local_478 = local_68;
        psVar30[-1] = 0x1276f4;
        std::vector<double,_std::allocator<double>_>::vector(&local_470,&local_60);
        local_458 = local_48;
        iVar29 = local_40._0_4_;
        psVar30[-1] = 0x12772a;
        iVar29 = outputDomains(&local_588,
                               (string *)
                               &allMu.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (MatrixProperties *)local_4a8,1,iVar29,-1);
        pdVar7 = local_470.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_40 = (double)CONCAT44(local_40._4_4_,iVar29);
        if (local_470.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          psVar30[-1] = 0x12773e;
          operator_delete(pdVar7);
        }
        _Var32._M_p = local_498._M_p;
        if (local_498._M_p != local_488) {
          psVar30[-1] = 0x127756;
          operator_delete(_Var32._M_p);
        }
        uVar24 = local_4a8._8_8_;
        if ((pointer)local_4a8._8_8_ != (pointer)0x0) {
          psVar30[-1] = 0x127767;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24);
        }
        pvVar8 = allMu.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (allMu.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_358) {
          psVar30[-1] = 0x12777f;
          operator_delete(pvVar8);
        }
        pDVar6 = local_588.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_588.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          psVar30[-1] = 0x127790;
          operator_delete(pDVar6);
        }
        auVar10 = auStack_118;
        dVar36 = ((double)p.outputPrefix.field_2._8_8_ - p.gammaMax) / (double)p.k;
        if (auStack_118 != (undefined1  [8])&consensusFile._M_string_length) {
          psVar30[-1] = 0x1277d0;
          operator_delete((void *)auVar10);
        }
        uVar24 = multiscaleFile.field_2._M_allocated_capacity;
        if (multiscaleFile.field_2._M_allocated_capacity != 0) {
          psVar30[-1] = 0x1277e1;
          operator_delete((void *)uVar24);
        }
        iVar29 = (int)(dVar36 + 0.5);
        psVar30[-1] = 0x1277fa;
        std::
        vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
        ::~vector((vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                   *)auStack_e8);
      }
      else {
        p.outputPrefix.field_2._8_8_ = psVar30[uVar34 - 1];
        p.gammaMax = *(double *)((long)&puStack_830 + uVar34 * 8 + lVar37);
        if ((undefined1  [8])
            dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
            super__Vector_impl_data._M_start != auStack_1f8) {
          psVar30[-1] = 0x126eb5;
          std::vector<Domain,_std::allocator<Domain>_>::operator=
                    ((vector<Domain,_std::allocator<Domain>_> *)((long)&p.chrom.field_2 + 8),
                     (vector<Domain,_std::allocator<Domain>_> *)auStack_1f8);
          if ((undefined1  [8])
              dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
              super__Vector_impl_data._M_start != auStack_1f8) {
            dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)auStack_1f8;
          }
        }
        local_308 = pcStack_140;
        uVar24 = p.chrom.field_2._8_8_;
        if ((pointer)p.chrom.field_2._8_8_ != pcStack_140) {
          do {
            data = *(matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     **)uVar24;
            local_320._16_8_ = uVar24;
            start1 = *(size_type *)(uVar24 + 8);
            psVar30[-1] = 0x126f1a;
            boost::numeric::ublas::
            subrange<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                      ((matrix_range<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                        *)auStack_e8,(ublas *)uVar11,data,start1,(size_type)data,start1,*psVar30);
            psVar30[-1] = 0x126f2c;
            boost::numeric::ublas::
            matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
            ::
            matrix<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>>
                      ((matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
                        *)auStack_118,
                       (matrix_expression<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                        *)auStack_e8);
            consensusFile_1.field_2._8_8_ = 0;
            psVar30[-1] = 0x126f4c;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::allocator<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>&>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mat_topass,
                       (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                        **)((long)&consensusFile_1.field_2 + 8),
                       (allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                        *)auStack_e8,
                       (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                        *)auStack_118);
            local_98._0_8_ = consensusFile_1.field_2._8_8_;
            psVar30[-1] = 0x126f69;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8),
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mat_topass);
            uVar24 = local_88._M_allocated_capacity;
            local_450._0_8_ = local_98._0_8_;
            local_450._8_8_ = local_98._8_8_;
            if ((pointer)local_98._8_8_ != (pointer)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                psVar1 = &((string *)local_98._8_8_)->_M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
                UNLOCK();
              }
              else {
                psVar1 = &((string *)local_98._8_8_)->_M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
              }
            }
            local_440._M_p = local_430;
            poVar25 = (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity);
            psVar30[-1] = 0x126fc7;
            std::__cxx11::string::_M_construct<char*>((string *)&local_440,uVar24,poVar25);
            local_420 = local_68;
            psVar30[-1] = 0x126fe0;
            std::vector<double,_std::allocator<double>_>::vector(&local_418,&local_60);
            iVar3 = p.stepSize._4_4_;
            sVar12 = p.k;
            iVar29 = p.gammaMin._0_4_;
            dVar36 = p.gammaMax;
            local_400 = local_48;
            mat_topass.
            super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p.outputPrefix.field_2._8_8_;
            psVar30[-1] = 0x127041;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::vector(&local_810,
                     (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)local_380);
            fVar40 = (float)(double)mat_topass.
                                    super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi;
            psVar30[-2] = local_a0;
            psVar30[-3] = 0x127088;
            multiscaleDomains((WeightedDomainEnsemble *)auStack_e8,(MatrixProperties *)local_450,
                              fVar40,(float)dVar36,(double)sVar12,iVar29,iVar3,areaCovered,
                              &local_810,(int)psVar30[-2]);
            psVar30[-1] = 0x127094;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_810);
            pbVar39 = local_38;
            pdVar7 = local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              psVar30[-1] = 0x1270a9;
              operator_delete(pdVar7);
            }
            _Var32._M_p = local_440._M_p;
            if (local_440._M_p != local_430) {
              psVar30[-1] = 0x1270c8;
              operator_delete(_Var32._M_p);
            }
            uVar24 = local_450._8_8_;
            if ((pointer)local_450._8_8_ != (pointer)0x0) {
              psVar30[-1] = 0x1270d9;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24);
            }
            psVar30[-1] = 0x1270ec;
            consensusDomains((DomainSet *)((long)local_358 + 0x10),
                             (WeightedDomainEnsemble *)auStack_e8);
            pDVar6 = dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((long)dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                      super__Vector_impl_data._M_start - local_358._16_8_ != 0) {
              lVar28 = ((long)dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>.
                              _M_impl.super__Vector_impl_data._M_start - local_358._16_8_ >> 3) *
                       -0x5555555555555555;
              lVar28 = lVar28 + (ulong)(lVar28 == 0);
              auVar41._8_4_ = (int)data;
              auVar41._0_8_ = data;
              auVar41._12_4_ = (int)((ulong)data >> 0x20);
              pDVar31 = (pointer)local_358._16_8_;
              do {
                pDVar31->start = (long)&data->size1_ + pDVar31->start;
                pDVar31->end = pDVar31->end + auVar41._8_8_;
                pDVar31 = pDVar31 + 1;
                lVar28 = lVar28 + -1;
              } while (lVar28 != 0);
            }
            psVar30[-1] = 0x127151;
            std::vector<Domain,std::allocator<Domain>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<Domain*,std::vector<Domain,std::allocator<Domain>>>>
                      ((vector<Domain,std::allocator<Domain>> *)auStack_1f8,pDVar6);
            uVar24 = p.inputFile.field_2._8_8_;
            local_258 = &consensusFile_1._M_string_length;
            pcVar26 = p.outputPrefix._M_dataplus._M_p + p.inputFile.field_2._8_8_;
            psVar30[-1] = 0x12717f;
            std::__cxx11::string::_M_construct<char*>((string *)&local_258,uVar24,pcVar26);
            psVar30[-1] = 0x12718e;
            std::__cxx11::string::append((char *)&local_258);
            psVar30[-1] = 0x1271a1;
            std::vector<Domain,_std::allocator<Domain>_>::vector
                      (&local_570,
                       (vector<Domain,_std::allocator<Domain>_> *)((long)local_358 + 0x10));
            psVar1 = local_258;
            dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_320;
            pcVar26 = consensusFile_1._M_dataplus._M_p + (long)local_258;
            psVar30[-1] = 0x1271cc;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       &dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,psVar1,pcVar26);
            uVar24 = local_88._M_allocated_capacity;
            local_3f8._0_8_ = local_98._0_8_;
            local_3f8._8_8_ = local_98._8_8_;
            if ((pointer)local_98._8_8_ != (pointer)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                psVar1 = &((string *)local_98._8_8_)->_M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
                UNLOCK();
              }
              else {
                psVar1 = &((string *)local_98._8_8_)->_M_string_length;
                *(int *)psVar1 = (int)*psVar1 + 1;
              }
            }
            local_3e8._M_p = local_3d8;
            poVar25 = (options_description *)(local_88._8_8_ + local_88._M_allocated_capacity);
            psVar30[-1] = 0x127227;
            std::__cxx11::string::_M_construct<char*>((string *)&local_3e8,uVar24,poVar25);
            local_3c8 = local_68;
            psVar30[-1] = 0x127240;
            std::vector<double,_std::allocator<double>_>::vector(&local_3c0,&local_60);
            iVar33 = iVar33 + 1;
            local_3a8 = local_48;
            iVar29 = local_40._0_4_;
            psVar30[-1] = 0x127283;
            iVar29 = outputDomains(&local_570,
                                   (string *)
                                   &dConsensusHier.
                                    super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,
                                   (MatrixProperties *)local_3f8,(int)uVar34,iVar29,iVar33);
            pdVar7 = local_3c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_40 = (double)CONCAT44(local_40._4_4_,iVar29);
            if (local_3c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              psVar30[-1] = 0x127297;
              operator_delete(pdVar7);
            }
            _Var32._M_p = local_3e8._M_p;
            if (local_3e8._M_p != local_3d8) {
              psVar30[-1] = 0x1272af;
              operator_delete(_Var32._M_p);
            }
            uVar24 = local_3f8._8_8_;
            if ((pointer)local_3f8._8_8_ != (pointer)0x0) {
              psVar30[-1] = 0x1272c0;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24);
            }
            pDVar6 = dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            if (dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage != (pointer)local_320) {
              psVar30[-1] = 0x1272d8;
              operator_delete(pDVar6);
            }
            pDVar6 = local_570.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (local_570.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              psVar30[-1] = 0x1272e9;
              operator_delete(pDVar6);
            }
            psVar1 = local_258;
            if (local_258 != &consensusFile_1._M_string_length) {
              psVar30[-1] = 0x127301;
              operator_delete(psVar1);
            }
            uVar24 = local_358._16_8_;
            if ((pointer)local_358._16_8_ != (pointer)0x0) {
              psVar30[-1] = 0x127312;
              operator_delete((void *)uVar24);
            }
            uVar24 = multiscaleFile.field_2._M_allocated_capacity;
            if (multiscaleFile.field_2._M_allocated_capacity != 0) {
              psVar30[-1] = 0x127323;
              operator_delete((void *)uVar24);
            }
            psVar30[-1] = 0x12732f;
            std::
            vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
            ::~vector((vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                       *)auStack_e8);
            this_00 = mat_topass.
                      super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            if (mat_topass.
                super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr != (element_type *)0x0) {
              psVar30[-1] = 0x127340;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
            }
            uVar24 = consensusFile.field_2._8_8_;
            if (consensusFile.field_2._M_allocated_capacity != 0) {
              psVar30[-1] = 0x127356;
              operator_delete((void *)uVar24);
            }
            uVar24 = local_320._16_8_ + 0x18;
          } while ((pointer)uVar24 != local_308);
        }
        psVar30[-1] = 0x127386;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Writing consensus for level ",0x1c);
        psVar30[-1] = 0x1273a0;
        plVar23 = (long *)std::ostream::operator<<(&std::cerr,(int)uVar34);
        uVar24 = *(undefined8 *)(*plVar23 + -0x18);
        psVar30[-1] = 0x1273b7;
        std::ios::widen((char)uVar24 + (char)plVar23);
        psVar30[-1] = 0x1273c2;
        std::ostream::put((char)plVar23);
        psVar30[-1] = 0x1273ca;
        std::ostream::flush();
        iVar29 = (int)local_a0 +
                 (int)(((double)p.outputPrefix.field_2._8_8_ - p.gammaMax) / (double)p.k + 0.5);
      }
      local_a0 = (ulong)(iVar29 + 1);
      uVar34 = uVar34 + 1;
    } while (uVar34 != iVar27 + 1);
  }
  psVar30[-1] = 0x127820;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_380);
  auVar10 = auStack_1f8;
  if (auStack_1f8 != (undefined1  [8])0x0) {
    psVar30[-1] = 0x127831;
    operator_delete((void *)auVar10);
  }
  uVar11 = p.chrom.field_2._8_8_;
  if (p.chrom.field_2._8_8_ != 0) {
    psVar30[-1] = 0x127846;
    operator_delete((void *)uVar11);
  }
  puVar9 = local_300;
  pvVar4 = (void *)CONCAT71(PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_,
                            PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_);
  if (pvVar4 != (void *)0x0) {
    *(undefined8 *)(local_300 + -8) = 0x12785e;
    operator_delete(pvVar4);
  }
  pvVar4 = (void *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_);
  if (pvVar4 != (void *)0x0) {
    *(undefined8 *)(puVar9 + -8) = 0x12786f;
    operator_delete(pvVar4);
  }
  if (dEnsemble.domainSets.
      super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    *(undefined8 *)(puVar9 + -8) = 0x127880;
    operator_delete(dEnsemble.domainSets.
                    super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  *(undefined8 *)(puVar9 + -8) = 0x12788c;
  std::
  vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  ::~vector((vector<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
             *)&temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  if (pbVar39 != (pointer)0x0) {
    *(undefined8 *)(puVar9 + -8) = 0x127899;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar39);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    *(undefined8 *)(puVar9 + -8) = 0x1278a7;
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar11 = local_88._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_allocated_capacity != &local_78) {
    *(undefined8 *)(puVar9 + -8) = 0x1278c3;
    operator_delete((void *)uVar11);
  }
  uVar11 = local_98._8_8_;
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    *(undefined8 *)(puVar9 + -8) = 0x1278d4;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11);
  }
  local_750 = (undefined1  [8])std::ios::clear;
  *(undefined8 *)(puVar9 + -8) = 0x1278ef;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_6e0);
  *(undefined8 *)(puVar9 + -8) = 0x1278fb;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_710);
  *(undefined8 *)(puVar9 + -8) = 0x127907;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_740);
  *(undefined8 *)(puVar9 + -8) = 0x127916;
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_768);
  if (local_790 != (void *)0x0) {
    *(undefined8 *)(puVar9 + -8) = 0x127924;
    operator_delete(local_790);
    local_790 = (void *)0x0;
    local_788 = 0;
    local_780 = 0;
    local_778 = 0;
    local_770 = 0;
  }
  *(undefined8 *)(puVar9 + -8) = 0x127956;
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_7a8);
  if (local_7d0 != local_7c0) {
    *(undefined8 *)(puVar9 + -8) = 0x12796b;
    operator_delete(local_7d0);
  }
  uVar11 = p._104_8_;
  if ((size_type *)p._104_8_ != &p.chrom._M_string_length) {
    *(undefined8 *)(puVar9 + -8) = 0x127983;
    operator_delete((void *)uVar11);
  }
  uVar11 = p.inputFile.field_2._8_8_;
  if ((size_type *)p.inputFile.field_2._8_8_ != &p.outputPrefix._M_string_length) {
    *(undefined8 *)(puVar9 + -8) = 0x127994;
    operator_delete((void *)uVar11);
  }
  auVar10 = local_1d8;
  if (local_1d8 != (undefined1  [8])&p.inputFile._M_string_length) {
    *(undefined8 *)(puVar9 + -8) = 0x1279a5;
    operator_delete((void *)auVar10);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  auto str = R"(
	***********************************
	****                           ****
	****        MATRYOSHKA 1.0     ****
	****                           ****
	***********************************
	)";

  namespace po = boost::program_options;
  using std::string;
  using std::cerr;


  class Params {
    public:
    string inputFile;
    string outputPrefix;
    double gammaMax;
    double gammaMin;
    size_t k;
    double stepSize;
    bool outputMultiscale;
    int minMeanSamples;
    int resolution;
    bool sparseFormat; //rao input data format
    string chrom;
  };

  Params p;

  // Declare the supported options.
  po::options_description opts("matryoshka options");
  opts.add_options()
  ("gammaMax,g", po::value<double>(&p.gammaMax)->required(), "gamma-max (highest resolution to generate domains)")
  ("gammaMin,x", po::value<double>(&p.gammaMin)->default_value(0), "gamma-min (lowest resolution to generate domains)")
  ("help,h", "Produce help message")
  ("input,i", po::value<string>(&p.inputFile)->required(), "Input matrix file, expected format (tab-separated): <chromo>\\t<start>\\t<end>\\t<f1 f2 ...>")
  ("topK,k", po::value<size_t>(&p.k)->default_value(1), "Compute the top k optimal solutions")  
  ("outputMultiscale,m", po::value<bool>(&p.outputMultiscale)->zero_tokens()->default_value(false), "Output multiscale domains that are used for clustering to files as well")
  ("minMeanSamples,n", po::value<int>(&p.minMeanSamples)->default_value(100), "Minimum required number of samples to compute a mean")
  ("output,o", po::value<string>(&p.outputPrefix)->required(), "Output filename prefix")  
  ("stepSize,s", po::value<double>(&p.stepSize)->default_value(0.05), "Step size to increment resolution parameter")
  ("resolution,r", po::value<int>(&p.resolution)->default_value(40000), "Resolution of data")
  ("parseSparseFormat,R", po::value<bool>(&p.sparseFormat)->zero_tokens()->default_value(false), "Parse the sparse matrix format")
  ("chromosome,c", po::value<string>(&p.chrom)->default_value("N/A"), "Chromosome");

  po::variables_map vm;
  try {
    po::store(po::parse_command_line(argc, argv, opts), vm);

    if (vm.count("help")) {
      cerr << str << "\n";
      cerr << opts << "\n";
      std::exit(1);
    }

    po::notify(vm);    

    if (vm.count("input")) {
      double eps = 1e-5;
      cerr << "Reading input from " << p.inputFile << ".\n";

      p.chrom = "chr" + p.chrom;
      MatrixProperties matProp;
      if (p.sparseFormat) {
        matProp = parseSparseMatrix(p.inputFile, p.resolution, p.chrom);
      } else { 
          matProp = parseGZipMatrix(p.inputFile);
      }
      auto mat = matProp.matrix;
      cerr << "MatrixParser read matrix of size: " << mat->size1() << " x " << mat->size2()  << "\n";

      auto dEnsemble = multiscaleDomains(matProp, p.gammaMax, p.gammaMin, p.stepSize, p.k, p.minMeanSamples);

      int areaCovered = calCoverage(dEnsemble, matProp);
      int K = dEnsemble.domainSets.size();

      if (p.outputMultiscale) {
        cerr << "Writing all multi scale domains to file" << endl;
        for (int i=0; i<K; i++){
            auto multiscaleFile = p.outputPrefix + ".multiscale.txt";
            outputDomains(dEnsemble.domainSets[i], multiscaleFile, matProp, 0, p.gammaMin+(i*p.stepSize));
        }
      }
      
      double **VI_S = new double *[K];
      for(int i = 0; i < K; i++)
        VI_S[i] = new double[K];
      getVImatrix(dEnsemble, VI_S);

      //for (int i=0;i<K;i++){
      //  for (int j=0; j<K-1; j++)
      //    cerr << VI_S[i][j] << ",";
      //  cerr << VI_S[i][K-1] << endl;
      //}

      std::vector<int> PAMresult = getCluster(VI_S, K);
      int resultSize = PAMresult.size();
      std::vector<int> temp = PAMresult;
      auto uniqEnd = std::unique(temp.begin(), temp.end());
      int maxHier = std::distance(temp.begin(), uniqEnd);
      
      cerr << "There are " << maxHier << " levels of hierarchy with clustering: " << endl;
      for (int i = 0; i<resultSize; i++){
        cerr << PAMresult[i] << " ";
      }
      cerr << endl;

      double gammaMins[maxHier], gammaMaxes[maxHier], gammaTemp=p.gammaMin;
      int index, indexTemp=PAMresult[0], sizeFill=0;
      gammaMins[0] = p.gammaMin; //start of array min gamma
      gammaMaxes[maxHier-1] = p.gammaMax; //end of array max gamma
      for (int i=0; i<resultSize; i++) {
        index = int(PAMresult[i]);
        if (indexTemp != index) {
          gammaMins[sizeFill+1] = gammaTemp;
          gammaMaxes[sizeFill] = gammaTemp - p.stepSize;
          indexTemp = index;
          sizeFill++;
        }
        gammaTemp += p.stepSize;
      }
      
      int curIndex=1, pIndex=0;
      std::vector<Domain> dConsensusParent, dConsensusHier, dConsensusHierTemp;
      std::vector<std::vector<double>> allMu(K);

      index = 0;
      for (double gamma=p.gammaMin; gamma <= p.gammaMax+eps; gamma+=p.stepSize) {
        allMu[index] = getMu(mat, gamma, p.minMeanSamples);
        index++;
      }

      index = 0;
      for (int hier=1; hier<=maxHier; hier++) {
        if (hier==1) {
          p.gammaMax = gammaMaxes[hier-1];
          p.gammaMin = gammaMins[hier-1];

          auto dEnsemble = multiscaleDomains(matProp, p.gammaMax, p.gammaMin, p.stepSize, p.k, p.minMeanSamples, areaCovered, allMu, index);
          dConsensusParent = consensusDomains(dEnsemble);
          
          auto consensusFile = p.outputPrefix + ".consensus.txt";
          cerr << "Writing consensus for level " << hier << endl;
          curIndex = outputDomains(dConsensusParent, consensusFile, matProp, hier, curIndex, -1);
          index = int(((p.gammaMax - p.gammaMin) / p.stepSize)+0.5) + 1;
        } 
        else { 
          p.gammaMax = gammaMaxes[hier-1];
          p.gammaMin = gammaMins[hier-1];
          if(dConsensusHierTemp.size() > 0) {
            dConsensusParent = dConsensusHierTemp;
            dConsensusHierTemp.clear();
          }

          for (auto d : dConsensusParent) {
            size_t start = d.start;
            size_t end = d.end;
            pIndex++;
            
            //boost::numeric::ublas::compressed_matrix<double> passed_ptr = subrange(*mat, start, end, start, end);
            //using SparseMatrix = boost::numeric::ublas::compressed_matrix<double>;
            //std::shared_ptr<SparseMatrix> mat_topass = make_shared<SparseMatrix>(passed_ptr);
            boost::numeric::ublas::matrix<double> passed_ptr = subrange(*mat, start, end, start, end);
            using SparseMatrix = boost::numeric::ublas::matrix<double>;
            std::shared_ptr<SparseMatrix> mat_topass = make_shared<SparseMatrix>(passed_ptr);
            matProp.matrix = mat_topass;
            auto dEnsemble = multiscaleDomains(matProp, p.gammaMax, p.gammaMin, p.stepSize, p.k, p.minMeanSamples, areaCovered, allMu, index);

            auto dConsensusHier = consensusDomains(dEnsemble);
            for (size_t i=0; i<dConsensusHier.size(); i++){
              dConsensusHier[i].start += start;
              dConsensusHier[i].end += start;
            }
            dConsensusHierTemp.insert(dConsensusHierTemp.end(), dConsensusHier.begin(), dConsensusHier.end());
            auto consensusFile = p.outputPrefix + ".consensus.txt";
            curIndex = outputDomains(dConsensusHier, consensusFile, matProp, hier, curIndex, pIndex);
          }
          cerr << "Writing consensus for level " << hier << endl;
          index += int(((p.gammaMax - p.gammaMin) / p.stepSize)+0.5) + 1;
        }
      }

    } else {
      cerr << "Input file was not set.\n";
      std::exit(1);
    }

  } catch (po::error& e) {
    cerr << "exception : [" << e.what() << "]. Exiting.\n";
    std::exit(1);
  }

  return 0;
}